

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_Enumerate(int nVars,int fDump,int fVerbose)

{
  uint uVar1;
  Vec_Mem_t *p;
  uint uVar2;
  abctime aVar3;
  Gem_Man_t *p_00;
  abctime aVar4;
  Gem_Obj_t *pGVar5;
  FILE *__stream;
  word *pwVar6;
  byte bVar7;
  abctime time;
  abctime time_00;
  abctime time_01;
  int iVar8;
  ulong uVar9;
  uint j;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  char local_418 [1000];
  
  aVar3 = Abc_Clock();
  p_00 = Gem_ManAlloc(nVars,fVerbose);
  iVar8 = 2;
  if (2 < nVars) {
    iVar8 = nVars;
  }
  uVar12 = 1;
  uVar15 = 1;
  while( true ) {
    uVar1 = p_00->nObjs;
    iVar13 = (int)aVar3;
    if (uVar12 == iVar8 - 1U) break;
    lVar14 = (long)(int)uVar1;
    pcVar11 = (char *)(ulong)uVar12;
    printf("Expanding  var %2d (functions = %10d)  ",pcVar11,(ulong)uVar1);
    aVar4 = Abc_Clock();
    Abc_PrintTime((int)aVar4 - iVar13,pcVar11,time);
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      uVar2 = *(uint *)(p_00->pObjs + uVar10) & 0xf;
      if ((uVar12 == uVar2) || (((long)(int)uVar15 <= (long)uVar10 && (uVar2 < uVar12)))) {
        for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
          if ((*(ushort *)&p_00->pObjs[uVar10].field_0x2 >> (uVar2 & 0x1f) & 1) != 0) {
            Gem_FuncExpand(p_00,(int)uVar10,uVar2);
          }
        }
      }
    }
    uVar15 = p_00->nObjs;
    pcVar11 = (char *)(ulong)uVar12;
    printf("Connecting var %2d (functions = %10d)  ",pcVar11,(ulong)uVar15);
    aVar4 = Abc_Clock();
    Abc_PrintTime((int)aVar4 - iVar13,pcVar11,time_00);
    for (; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
      pGVar5 = p_00->pObjs;
      for (uVar15 = 0; uVar15 < (*(uint *)(pGVar5 + lVar14) & 0xf); uVar15 = uVar15 + 1) {
        uVar2 = uVar15;
        if (((*(uint *)(pGVar5 + lVar14) >> 0x10) >> (uVar15 & 0x1f) & 1) != 0) {
          while( true ) {
            j = uVar2 + 1;
            if ((*(uint *)(pGVar5 + lVar14) & 0xf) <= j) break;
            bVar7 = (byte)uVar2;
            uVar2 = j;
            if (((*(uint *)(pGVar5 + lVar14) >> 0x10) >> (bVar7 & 0x1f) & 2) != 0) {
              Gem_FuncReduce(p_00,(int)lVar14,uVar15,j);
              pGVar5 = p_00->pObjs;
            }
          }
        }
      }
      uVar15 = p_00->nObjs;
    }
    uVar12 = uVar12 + 1;
    uVar15 = uVar1;
  }
  pcVar11 = (char *)(ulong)uVar1;
  printf("Finished          (functions = %10d)  ");
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - iVar13,pcVar11,time_01);
  if (fDump != 0) {
    p = p_00->vTtMem;
    sprintf(local_418,"tt_%s_%02d.txt","enum",(ulong)(uint)nVars);
    __stream = fopen(local_418,"wb");
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)p->nEntries);
    }
    iVar8 = 0;
    while ((iVar8 < p->nEntries && (pwVar6 = Vec_MemReadEntry(p,iVar8), pwVar6 != (word *)0x0))) {
      uVar9 = (ulong)(uint)p->nEntrySize;
      while (0 < (int)uVar9) {
        uVar9 = uVar9 - 1;
        bVar7 = 0x3c;
        for (iVar13 = 0xf; -1 < iVar13; iVar13 = iVar13 + -1) {
          uVar12 = (uint)(pwVar6[uVar9] >> (bVar7 & 0x3f)) & 0xf;
          if (uVar12 < 10) {
            fprintf(__stream,"%d");
          }
          else {
            fputc(uVar12 + 0x37,__stream);
          }
          bVar7 = bVar7 - 4;
        }
      }
      fputc(10,__stream);
      iVar8 = iVar8 + 1;
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)p->nEntrySize * (double)p->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)p->nEntries,(ulong)(uint)nVars,local_418);
  }
  Gem_ManFree(p_00);
  return 0;
}

Assistant:

int Gem_Enumerate( int nVars, int fDump, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gem_Man_t * p = Gem_ManAlloc( nVars, fVerbose );
    int v, f, i, j, nObjsStop = 1;
    for ( v = 1; v <= nVars-2; v++ )
    {
        // expand functions by adding a gate
        int nObjsStopPrev = nObjsStop;
        nObjsStop = p->nObjs;
        printf( "Expanding  var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = 0; f < nObjsStop; f++ )
            if ( v == (int)p->pObjs[f].nVars || (v > (int)p->pObjs[f].nVars && f >= nObjsStopPrev) )
                for ( i = 0; i < v; i++ )
                    if ( (int)p->pObjs[f].Groups & (1 << i) )
                        Gem_FuncExpand( p, f, i );
        // reduce functions by adding a crossbar
        printf( "Connecting var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = nObjsStop; f < p->nObjs; f++ )
            for ( i = 0; i < (int)p->pObjs[f].nVars; i++ )
                if ( (int)p->pObjs[f].Groups & (1 << i) )
                    for ( j = i+1; j < (int)p->pObjs[f].nVars; j++ )
                        if ( (int)p->pObjs[f].Groups & (1 << j) )
                            if ( Gem_FuncReduce( p, f, i, j ) )
                                return Gem_ManFree( p );
    }
    printf( "Finished          (functions = %10d)  ", p->nObjs );
    Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
    if ( fDump ) Vec_MemDumpTruthTables( p->vTtMem, "enum", nVars );
    Gem_ManFree( p );
    return 0;
}